

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  float *pfVar2;
  ImVec4 *pIVar3;
  ImDrawVert *pIVar4;
  ImVec4 *pIVar5;
  ImVec2 IVar6;
  ImDrawIdx IVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ImU32 IVar13;
  int iVar14;
  char cVar15;
  ImDrawIdx *pIVar16;
  ulong uVar17;
  ImDrawIdx IVar18;
  undefined7 in_register_00000081;
  long lVar19;
  undefined8 *puVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  uint uVar23;
  ImDrawIdx IVar24;
  int iVar25;
  ImVec2 IVar26;
  ImDrawIdx IVar27;
  int iVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  float local_a8;
  ImVec2 *local_98;
  ImVec2 local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong local_40;
  ImU32 local_38;
  byte local_31;
  
  if (1 < points_count) {
    IVar26 = this->_Data->TexUvWhitePixel;
    local_60 = (ulong)(points_count - 1U);
    local_74 = (undefined4)CONCAT71(in_register_00000081,closed);
    uVar10 = (ulong)(points_count - 1U);
    if (closed) {
      uVar10 = (ulong)(uint)points_count;
    }
    iVar25 = (int)uVar10;
    local_88 = thickness;
    local_38 = col;
    if ((this->Flags & 1U) == 0) {
      uStack_d0 = 0x13954e;
      PrimReserve(this,iVar25 * 6,iVar25 * 4);
      if (0 < iVar25) {
        fVar32 = local_88 * 0.5;
        uVar11 = 1;
        fVar31 = fVar32;
        IVar13 = local_38;
        local_98 = points;
        local_90 = IVar26;
        local_88 = fVar32;
        fStack_84 = fVar32;
        fStack_80 = fVar32;
        fStack_7c = fVar32;
        do {
          uVar17 = uVar11;
          if ((uint)points_count == uVar11) {
            uVar17 = 0;
          }
          local_58._0_4_ = points[uVar17].x - points[uVar11 - 1].x;
          local_58._4_4_ = points[uVar17].y - points[uVar11 - 1].y;
          fVar30 = (float)local_58 * (float)local_58 + local_58._4_4_ * local_58._4_4_;
          if (0.0 < fVar30) {
            if (fVar30 < 0.0) {
              uStack_50 = 0;
              uStack_d0 = 0x1395e4;
              fVar30 = sqrtf(fVar30);
              IVar26 = local_90;
              points = local_98;
              fVar32 = local_88;
              fVar31 = fStack_84;
              IVar13 = local_38;
            }
            else {
              fVar30 = SQRT(fVar30);
            }
            local_58._0_4_ = (float)local_58 * (1.0 / fVar30);
            local_58._4_4_ = local_58._4_4_ * (1.0 / fVar30);
          }
          local_58._0_4_ = (float)local_58 * fVar32;
          local_58._4_4_ = local_58._4_4_ * fVar31;
          pIVar4 = this->_VtxWritePtr;
          IVar6.y = points[uVar11 - 1].y - (float)local_58;
          IVar6.x = points[uVar11 - 1].x + local_58._4_4_;
          pIVar4->pos = IVar6;
          pIVar4->uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = IVar13;
          pIVar4[1].pos.x = points[uVar17].x + local_58._4_4_;
          pIVar4[1].pos.y = points[uVar17].y - (float)local_58;
          pIVar4[1].uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = IVar13;
          pIVar4[2].pos.x = points[uVar17].x - local_58._4_4_;
          pIVar4[2].pos.y = points[uVar17].y + (float)local_58;
          pIVar4[2].uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = IVar13;
          pIVar4[3].pos.x = points[uVar11 - 1].x - local_58._4_4_;
          pIVar4[3].pos.y = points[uVar11 - 1].y + (float)local_58;
          pIVar4[3].uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = IVar13;
          this->_VtxWritePtr = pIVar4 + 4;
          uVar8 = this->_VtxCurrentIdx;
          pIVar16 = this->_IdxWritePtr;
          IVar7 = (ImDrawIdx)uVar8;
          *pIVar16 = IVar7;
          pIVar16[1] = IVar7 + 1;
          pIVar16[2] = IVar7 + 2;
          pIVar16[3] = IVar7;
          pIVar16[4] = IVar7 + 2;
          pIVar16[5] = IVar7 + 3;
          this->_IdxWritePtr = pIVar16 + 6;
          this->_VtxCurrentIdx = uVar8 + 4;
          bVar29 = uVar11 != uVar10;
          uVar11 = uVar11 + 1;
        } while (bVar29);
      }
    }
    else {
      local_a8 = thickness;
      if (thickness <= 1.0) {
        local_a8 = 1.0;
      }
      local_6c = (int)local_a8;
      fVar32 = this->_FringeScale;
      local_31 = fVar32 == 1.0 & local_6c < 0x3f & (byte)this->Flags >> 1 &
                 local_a8 - (float)local_6c <= 1e-05;
      iVar28 = 0x12;
      if (thickness <= fVar32) {
        iVar28 = 0xc;
      }
      iVar14 = 6;
      if (local_31 == 0) {
        iVar14 = iVar28;
      }
      local_b8 = ZEXT416((uint)fVar32);
      if (local_31 == 1) {
        local_70 = points_count * 2;
        iVar28 = 3;
      }
      else {
        local_70 = points_count * 3;
        if (fVar32 < thickness) {
          local_70 = points_count * 4;
        }
        iVar28 = (uint)(fVar32 < thickness) * 2 + 3;
      }
      uStack_d0 = 0x1397fb;
      local_68 = uVar10;
      PrimReserve(this,iVar14 * iVar25,local_70);
      lVar19 = -((ulong)(uint)(iVar28 * points_count) * 8 + 0xf & 0xfffffffffffffff0);
      puVar20 = (undefined8 *)((long)&local_c8 + lVar19);
      local_48 = (ulong)(uint)points_count;
      uVar10 = (ulong)(uint)points_count;
      local_58 = puVar20;
      local_40 = uVar10;
      IVar13 = local_38;
      if (0 < (int)local_68) {
        uVar17 = local_68 & 0xffffffff;
        uVar11 = 1;
        do {
          uVar9 = uVar11;
          if (uVar10 == uVar11) {
            uVar9 = 0;
          }
          local_c8 = points[uVar9].x - points[uVar11 - 1].x;
          fStack_c4 = points[uVar9].y - points[uVar11 - 1].y;
          fVar32 = local_c8 * local_c8 + fStack_c4 * fStack_c4;
          if (0.0 < fVar32) {
            if (fVar32 < 0.0) {
              uStack_c0 = 0;
              *(undefined8 *)((long)&uStack_d0 + lVar19) = 0x13989a;
              fVar32 = sqrtf(fVar32);
              puVar20 = local_58;
              uVar10 = local_40;
              IVar13 = local_38;
            }
            else {
              fVar32 = SQRT(fVar32);
            }
            local_c8 = local_c8 * (1.0 / fVar32);
            fStack_c4 = fStack_c4 * (1.0 / fVar32);
          }
          *(float *)(puVar20 + (uVar11 - 1)) = fStack_c4;
          *(float *)((long)puVar20 + uVar11 * 8 + -4) = -local_c8;
          bVar29 = uVar11 != uVar17;
          uVar11 = uVar11 + 1;
        } while (bVar29);
      }
      pfVar1 = (float *)(puVar20 + uVar10);
      cVar15 = (char)local_74;
      if (cVar15 == '\0') {
        puVar20[local_60 & 0xffffffff] = *(undefined8 *)(pfVar1 + -4);
      }
      uVar8 = IVar13 & 0xffffff;
      if ((local_88 <= (float)local_b8._0_4_ | local_31) == 1) {
        fVar32 = (float)local_b8._0_4_;
        if (local_31 != 0) {
          fVar32 = local_a8 * 0.5 + 1.0;
        }
        if (cVar15 == '\0') {
          fVar31 = (float)*puVar20 * fVar32;
          fVar30 = (float)((ulong)*puVar20 >> 0x20) * fVar32;
          fVar33 = (*points).x;
          fVar34 = (*points).y;
          *pfVar1 = fVar31 + fVar33;
          pfVar1[1] = fVar30 + fVar34;
          pfVar1[2] = fVar33 - fVar31;
          pfVar1[3] = fVar34 - fVar30;
          uVar10 = local_60 & 0xffffffff;
          fVar31 = points[uVar10].x;
          fVar30 = points[uVar10].y;
          uVar11 = (ulong)(uint)((int)local_60 * 2);
          *(ulong *)(pfVar1 + uVar11 * 2) =
               CONCAT44((float)((ulong)puVar20[uVar10] >> 0x20) * fVar32 + fVar30,
                        (float)puVar20[uVar10] * fVar32 + fVar31);
          *(ulong *)(pfVar1 + uVar11 * 2 + 2) =
               CONCAT44(fVar30 - (float)((ulong)puVar20[uVar10] >> 0x20) * fVar32,
                        fVar31 - (float)puVar20[uVar10] * fVar32);
        }
        if (0 < (int)local_68) {
          uVar12 = (uint)local_31;
          pIVar16 = this->_IdxWritePtr;
          uVar10 = 1;
          uVar22 = this->_VtxCurrentIdx;
          do {
            uVar11 = uVar10 & 0xffffffff;
            if (local_40 == uVar10) {
              uVar11 = 0;
            }
            uVar23 = uVar22 + (uVar12 ^ 3);
            if (local_40 == uVar10) {
              uVar23 = this->_VtxCurrentIdx;
            }
            fVar34 = points[uVar11].x;
            fVar35 = points[uVar11].y;
            fVar30 = ((float)local_58[uVar11] + (float)local_58[uVar10 - 1]) * 0.5;
            fVar33 = ((float)((ulong)local_58[uVar11] >> 0x20) +
                     (float)((ulong)local_58[uVar10 - 1] >> 0x20)) * 0.5;
            fVar37 = fVar30 * fVar30 + fVar33 * fVar33;
            fVar31 = 0.5;
            if (0.5 <= fVar37) {
              fVar31 = fVar37;
            }
            fVar30 = (1.0 / fVar31) * fVar30 * fVar32;
            fVar31 = (1.0 / fVar31) * fVar33 * fVar32;
            pfVar2 = pfVar1 + (ulong)(uint)((int)uVar11 * 2) * 2;
            *pfVar2 = fVar30 + fVar34;
            pfVar2[1] = fVar31 + fVar35;
            pfVar2[2] = fVar34 - fVar30;
            pfVar2[3] = fVar35 - fVar31;
            IVar21 = (ImDrawIdx)uVar23;
            *pIVar16 = IVar21;
            IVar7 = (ImDrawIdx)uVar22;
            pIVar16[1] = IVar7;
            if (local_31 == 0) {
              pIVar16[2] = IVar7 + 2;
              pIVar16[3] = IVar7 + 2;
              pIVar16[4] = IVar21 + 2;
              pIVar16[5] = IVar21;
              pIVar16[6] = IVar21 + 1;
              pIVar16[7] = IVar7 + 1;
              pIVar16[8] = IVar7;
              pIVar16[9] = IVar7;
              pIVar16[10] = IVar21;
              pIVar16[0xb] = IVar21 + 1;
              lVar19 = 0x18;
            }
            else {
              pIVar16[2] = IVar7 + 1;
              pIVar16[3] = IVar21 + 1;
              pIVar16[4] = IVar7 + 1;
              pIVar16[5] = IVar21;
              lVar19 = 0xc;
            }
            pIVar16 = (ImDrawIdx *)((long)pIVar16 + lVar19);
            this->_IdxWritePtr = pIVar16;
            bVar29 = uVar10 != (local_68 & 0xffffffff);
            uVar10 = uVar10 + 1;
            uVar22 = uVar23;
          } while (bVar29);
        }
        if (local_31 == 0) {
          uVar10 = 1;
          if (1 < (int)local_48) {
            uVar10 = local_48 & 0xffffffff;
          }
          lVar19 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar19);
            this->_VtxWritePtr->uv = IVar26;
            pIVar4 = this->_VtxWritePtr;
            pIVar4->col = local_38;
            pIVar4[1].pos = *(ImVec2 *)((long)local_58 + lVar19 * 2 + local_40 * 8);
            this->_VtxWritePtr[1].uv = IVar26;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].col = uVar8;
            pIVar4[2].pos = *(ImVec2 *)((long)local_58 + lVar19 * 2 + local_40 * 8 + 8);
            this->_VtxWritePtr[2].uv = IVar26;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[2].col = uVar8;
            this->_VtxWritePtr = pIVar4 + 3;
            lVar19 = lVar19 + 8;
          } while (uVar10 * 8 != lVar19);
        }
        else {
          uVar10 = 1;
          if (1 < (int)local_48) {
            uVar10 = local_48 & 0xffffffff;
          }
          pIVar5 = this->_Data->TexUvLines;
          pIVar3 = pIVar5 + local_6c;
          fVar32 = pIVar3->x;
          fVar31 = pIVar3->y;
          pIVar5 = pIVar5 + local_6c;
          fVar30 = pIVar5->z;
          fVar33 = pIVar5->w;
          lVar19 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)local_58 + lVar19 + local_40 * 8);
            pIVar4 = this->_VtxWritePtr;
            (pIVar4->uv).x = fVar32;
            (pIVar4->uv).y = fVar31;
            pIVar4 = this->_VtxWritePtr;
            pIVar4->col = local_38;
            pIVar4[1].pos = *(ImVec2 *)((long)local_58 + lVar19 + local_40 * 8 + 8);
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].uv.x = fVar30;
            pIVar4[1].uv.y = fVar33;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].col = local_38;
            this->_VtxWritePtr = pIVar4 + 2;
            lVar19 = lVar19 + 0x10;
          } while (uVar10 * 0x10 != lVar19);
        }
      }
      else {
        fVar32 = (local_a8 - (float)local_b8._0_4_) * 0.5;
        uVar22 = (uint)local_48;
        if (cVar15 == '\0') {
          fVar31 = (float)local_b8._0_4_ + fVar32;
          fVar30 = (float)*puVar20;
          fVar33 = (float)((ulong)*puVar20 >> 0x20);
          fVar34 = fVar31 * fVar30;
          fVar35 = fVar31 * fVar33;
          fVar37 = (*points).x;
          fVar36 = (*points).y;
          fVar30 = fVar30 * fVar32;
          fVar33 = fVar33 * fVar32;
          *pfVar1 = fVar34 + fVar37;
          pfVar1[1] = fVar35 + fVar36;
          pfVar1[2] = fVar30 + fVar37;
          pfVar1[3] = fVar33 + fVar36;
          pfVar1[4] = fVar37 - fVar30;
          pfVar1[5] = fVar36 - fVar33;
          pfVar1[6] = fVar37 - fVar34;
          pfVar1[7] = fVar36 - fVar35;
          uVar11 = local_60 & 0xffffffff;
          fVar30 = points[uVar11].x;
          fVar33 = points[uVar11].y;
          uVar17 = (ulong)(uint)((int)local_60 << 2);
          *(ulong *)(pfVar1 + uVar17 * 2) =
               CONCAT44((float)((ulong)puVar20[uVar11] >> 0x20) * fVar31 + fVar33,
                        (float)puVar20[uVar11] * fVar31 + fVar30);
          *(ulong *)(pfVar1 + uVar17 * 2 + 2) =
               CONCAT44((float)((ulong)puVar20[uVar11] >> 0x20) * fVar32 + fVar33,
                        (float)puVar20[uVar11] * fVar32 + fVar30);
          *(ulong *)(pfVar1 + uVar17 * 2 + 4) =
               CONCAT44(fVar33 - (float)((ulong)puVar20[uVar11] >> 0x20) * fVar32,
                        fVar30 - (float)puVar20[uVar11] * fVar32);
          *(ulong *)(pfVar1 + uVar17 * 2 + 6) =
               CONCAT44(fVar33 - (float)((ulong)puVar20[uVar11] >> 0x20) * fVar31,
                        fVar30 - (float)puVar20[uVar11] * fVar31);
        }
        if (0 < (int)local_68) {
          pIVar16 = this->_IdxWritePtr;
          uVar11 = 1;
          uVar22 = this->_VtxCurrentIdx;
          do {
            uVar17 = uVar11 & 0xffffffff;
            if (uVar10 == uVar11) {
              uVar17 = 0;
            }
            fVar30 = ((float)puVar20[uVar17] + (float)puVar20[uVar11 - 1]) * 0.5;
            fVar33 = ((float)((ulong)puVar20[uVar17] >> 0x20) +
                     (float)((ulong)puVar20[uVar11 - 1] >> 0x20)) * 0.5;
            fVar34 = fVar30 * fVar30 + fVar33 * fVar33;
            fVar31 = 0.5;
            if (0.5 <= fVar34) {
              fVar31 = fVar34;
            }
            uVar12 = uVar22 + 4;
            if (uVar10 == uVar11) {
              uVar12 = this->_VtxCurrentIdx;
            }
            fVar31 = 1.0 / fVar31;
            fVar37 = points[uVar17].x;
            fVar36 = points[uVar17].y;
            fVar34 = fVar30 * fVar31 * ((float)local_b8._0_4_ + fVar32);
            fVar35 = fVar33 * fVar31 * ((float)local_b8._0_4_ + fVar32);
            fVar30 = fVar30 * fVar31 * fVar32;
            fVar31 = fVar33 * fVar31 * fVar32;
            uVar10 = (ulong)(uint)((int)uVar17 << 2);
            pfVar2 = pfVar1 + uVar10 * 2;
            *pfVar2 = fVar37 + fVar34;
            pfVar2[1] = fVar36 + fVar35;
            pfVar2[2] = fVar37 + fVar30;
            pfVar2[3] = fVar36 + fVar31;
            IVar7 = (ImDrawIdx)uVar12;
            IVar27 = IVar7 + 1;
            pfVar2 = pfVar1 + uVar10 * 2 + 4;
            *pfVar2 = fVar37 - fVar30;
            pfVar2[1] = fVar36 - fVar31;
            pfVar2[2] = fVar37 - fVar34;
            pfVar2[3] = fVar36 - fVar35;
            *pIVar16 = IVar27;
            IVar21 = (ImDrawIdx)uVar22;
            IVar24 = IVar21 + 2;
            pIVar16[1] = IVar21 + 1;
            pIVar16[2] = IVar24;
            pIVar16[3] = IVar24;
            IVar18 = IVar7 + 2;
            pIVar16[4] = IVar18;
            pIVar16[5] = IVar27;
            pIVar16[6] = IVar27;
            pIVar16[7] = IVar21 + 1;
            pIVar16[8] = IVar21;
            pIVar16[9] = IVar21;
            pIVar16[10] = IVar7;
            pIVar16[0xb] = IVar27;
            pIVar16[0xc] = IVar18;
            pIVar16[0xd] = IVar24;
            pIVar16[0xe] = IVar21 + 3;
            pIVar16[0xf] = IVar21 + 3;
            pIVar16[0x10] = IVar7 + 3;
            pIVar16[0x11] = IVar18;
            pIVar16 = pIVar16 + 0x12;
            bVar29 = uVar11 != (local_68 & 0xffffffff);
            uVar11 = uVar11 + 1;
            puVar20 = local_58;
            uVar10 = local_40;
            uVar22 = uVar12;
          } while (bVar29);
          this->_IdxWritePtr = pIVar16;
          uVar22 = (uint)local_48;
          IVar13 = local_38;
        }
        uVar11 = 1;
        if (1 < (int)uVar22) {
          uVar11 = (ulong)uVar22;
        }
        lVar19 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar20 + lVar19 + uVar10 * 8);
          this->_VtxWritePtr->uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = uVar8;
          pIVar4[1].pos = *(ImVec2 *)((long)puVar20 + lVar19 + uVar10 * 8 + 8);
          this->_VtxWritePtr[1].uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = IVar13;
          pIVar4[2].pos = *(ImVec2 *)((long)puVar20 + lVar19 + uVar10 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = IVar13;
          pIVar4[3].pos = *(ImVec2 *)((long)puVar20 + lVar19 + uVar10 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = IVar26;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = uVar8;
          this->_VtxWritePtr = pIVar4 + 4;
          lVar19 = lVar19 + 0x20;
        } while (uVar11 * 0x20 != lVar19);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_70;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}